

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O0

PDFObject * __thiscall PDFObjectParser::ParseNumber(PDFObjectParser *this,string *inToken)

{
  long lVar1;
  PDFObjectParser *pPVar2;
  Trace *this_00;
  double inValue;
  BoxingBaseWithRW<long_long,_STDStreamsReader<long_long>,_STDStreamsWriter<long_long>_> local_48;
  longlong local_40;
  longlong integerValue;
  BoxingBaseWithRW<double,_STDStreamsReader<double>,_STDStreamsWriter<double>_> local_28;
  string *local_20;
  string *inToken_local;
  PDFObjectParser *this_local;
  
  local_20 = inToken;
  inToken_local = (string *)this;
  lVar1 = std::__cxx11::string::find((char)inToken,0x2e);
  if (lVar1 == -1) {
    BoxingBaseWithRW<long_long,_STDStreamsReader<long_long>,_STDStreamsWriter<long_long>_>::
    BoxingBaseWithRW(&local_48,local_20);
    local_40 = BoxingBase::operator_cast_to_long_long((BoxingBase *)&local_48);
    if ((local_40 < 0x80000000) && (-0x80000001 < local_40)) {
      pPVar2 = (PDFObjectParser *)operator_new(0x50);
      PDFInteger::PDFInteger((PDFInteger *)pPVar2,local_40);
      this_local = pPVar2;
    }
    else {
      this_00 = Trace::DefaultTrace();
      Trace::TraceToLog(this_00,
                        "PDFObjectParser::ParseNumber, parsed integer %lld is outside of the allowed range for PDF integers - %ld to %ld"
                        ,local_40,0xffffffff80000000,0x7fffffff);
      this_local = (PDFObjectParser *)0x0;
    }
  }
  else {
    pPVar2 = (PDFObjectParser *)operator_new(0x50);
    BoxingBaseWithRW<double,_STDStreamsReader<double>,_STDStreamsWriter<double>_>::BoxingBaseWithRW
              (&local_28,local_20);
    inValue = BoxingBase::operator_cast_to_double((BoxingBase *)&local_28);
    PDFReal::PDFReal((PDFReal *)pPVar2,inValue);
    this_local = pPVar2;
  }
  return (PDFObject *)this_local;
}

Assistant:

PDFObject* PDFObjectParser::ParseNumber(const std::string& inToken)
{
	// once we know this is a number, then parsing is easy. just determine if it's a real or integer, so as to separate classes for better accuracy
	if(inToken.find(scDot) != inToken.npos) {
		return new PDFReal(Double(inToken));
	} else {
		long long integerValue = LongLong(inToken);

		// validate int value according to PDF limits. ignore if outside of range
		if((integerValue > MAX_PDF_INT) || (integerValue < MIN_PDF_INT)) {
			TRACE_LOG3("PDFObjectParser::ParseNumber, parsed integer %lld is outside of the allowed range for PDF integers - %ld to %ld", integerValue, MIN_PDF_INT, MAX_PDF_INT);
			return NULL;
		}

		return new PDFInteger(integerValue);
	}
}